

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O3

Cluster * __thiscall amrex::Cluster::new_chop(Cluster *this)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  int minlen;
  int iVar6;
  uint uVar7;
  long lVar8;
  IntVect *pIVar9;
  Cluster *this_00;
  undefined8 extraout_RAX;
  int n;
  int *piVar10;
  ulong uVar11;
  int iVar12;
  CutStatus CVar13;
  IntVect *pIVar14;
  IntVect *pIVar15;
  int iVar16;
  long lVar17;
  IntVect *pIVar18;
  ulong uVar19;
  undefined8 unaff_R13;
  undefined8 uVar20;
  vector<int,_std::allocator<int>_> *pvVar21;
  IntVect cut;
  CutStatus status [3];
  Array<Vector<int>,_3> hist;
  ulong local_110;
  uint local_108;
  uint local_104;
  ulong local_100;
  ulong local_f8;
  long local_f0;
  undefined8 local_e8;
  int local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  ulong local_c8;
  double local_c0;
  ulong local_b8;
  ulong local_b0;
  CutStatus CStack_a4;
  long local_a0;
  vector<int,_std::allocator<int>_> local_98;
  vector<int,_std::allocator<int>_> vStack_80;
  vector<int,_std::allocator<int>_> local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  
  iVar6 = (this->m_bx).smallend.vect[1];
  iVar12 = (this->m_bx).bigend.vect[1];
  iVar16 = (this->m_bx).bigend.vect[2];
  iVar2 = (this->m_bx).smallend.vect[2];
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  vStack_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  vStack_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_100 = local_100 & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::resize
            (&local_98,(long)(((this->m_bx).bigend.vect[0] - (this->m_bx).smallend.vect[0]) + 1),
             (value_type_conflict *)&local_100);
  local_100 = local_100 & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::resize
            (&vStack_80,(long)((iVar12 - iVar6) + 1),(value_type_conflict *)&local_100);
  local_100 = local_100 & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::resize
            (&local_68,(long)((iVar16 - iVar2) + 1),(value_type_conflict *)&local_100);
  lVar8 = this->m_len;
  if (0 < lVar8) {
    piVar10 = this->m_ar->vect + 2;
    do {
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(long)((IntVect *)(piVar10 + -2))->vect[0] - (long)(this->m_bx).smallend.vect[0]] =
           local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[(long)((IntVect *)(piVar10 + -2))->vect[0] - (long)(this->m_bx).smallend.vect[0]
                   ] + 1;
      vStack_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(long)piVar10[-1] - (long)(this->m_bx).smallend.vect[1]] =
           vStack_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[(long)piVar10[-1] - (long)(this->m_bx).smallend.vect[1]] + 1;
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(long)*piVar10 - (long)(this->m_bx).smallend.vect[2]] =
           local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[(long)*piVar10 - (long)(this->m_bx).smallend.vect[2]] + 1;
      piVar10 = piVar10 + 3;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  uVar20 = CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
  uVar19 = 0;
  uVar11 = 0xffffffff;
  do {
    local_b0 = uVar19;
    local_110 = 0;
    local_108 = 0;
    CVar13 = InvalidCut;
    pvVar21 = &local_98;
    lVar8 = 0;
    do {
      if ((uVar11 & 0xffffffff) << 2 != lVar8) {
        iVar6 = FindCut((pvVar21->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start,
                        *(int *)((long)(this->m_bx).smallend.vect + lVar8),
                        *(int *)((long)(this->m_bx).bigend.vect + lVar8),
                        (CutStatus *)((long)&CStack_a4 + lVar8));
        *(int *)((long)&local_110 + lVar8) = iVar6;
        if ((int)*(CutStatus *)((long)&CStack_a4 + lVar8) < (int)CVar13) {
          CVar13 = *(CutStatus *)((long)&CStack_a4 + lVar8);
        }
      }
      lVar8 = lVar8 + 4;
      pvVar21 = pvVar21 + 1;
    } while (lVar8 != 0xc);
    iVar6 = -1;
    uVar11 = 0;
    uVar19 = 0xffffffff;
    do {
      if ((&CStack_a4)[uVar11] == CVar13) {
        iVar12 = *(int *)((long)&local_110 + uVar11 * 4);
        iVar16 = (this->m_bx).bigend.vect[uVar11] - iVar12;
        iVar12 = iVar12 - (this->m_bx).smallend.vect[uVar11];
        if (iVar12 <= iVar16) {
          iVar16 = iVar12;
        }
        if (iVar6 <= iVar16) {
          uVar19 = uVar11 & 0xffffffff;
        }
        if (iVar6 < iVar16) {
          iVar6 = iVar16;
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != 3);
    lVar8 = (long)(int)uVar19;
    iVar6 = (this->m_bx).smallend.vect[lVar8];
    iVar12 = *(int *)((long)&local_110 + lVar8 * 4);
    if (iVar12 <= iVar6) {
LAB_0063c0fd:
      this_00 = chop(this);
      goto LAB_0063c10b;
    }
    lVar17 = 0;
    uVar7 = 0;
    do {
      uVar7 = uVar7 + (&local_98)[lVar8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar17];
      lVar17 = lVar17 + 1;
    } while ((long)iVar12 - (long)iVar6 != lVar17);
    if ((int)uVar7 < 1) goto LAB_0063c0fd;
    lVar8 = this->m_len;
    if (lVar8 <= (long)(ulong)uVar7) goto LAB_0063c0fd;
    local_b8 = (ulong)uVar7;
    local_d8 = CONCAT44(local_d8._4_4_,(int)lVar8 - uVar7);
    pIVar9 = this->m_ar;
    local_c8 = uVar19;
    local_100 = local_110;
    local_f8 = uVar19 << 0x20 | (ulong)local_108;
    pIVar14 = pIVar9 + lVar8;
    do {
      lVar8 = (long)(int)uVar19;
      iVar6 = *(int *)((long)&local_100 + lVar8 * 4);
      while (pIVar9->vect[lVar8] < iVar6) {
        pIVar9 = pIVar9 + 1;
        pIVar15 = pIVar14;
        if (pIVar9 == pIVar14) goto LAB_0063bf36;
      }
      do {
        pIVar18 = pIVar14;
        pIVar14 = pIVar18 + -1;
        pIVar15 = pIVar9;
        if (pIVar14 == pIVar9) goto LAB_0063bf36;
      } while (iVar6 <= pIVar18[-1].vect[lVar8]);
      local_e0 = pIVar9->vect[2];
      local_e8 = *(undefined8 *)pIVar9->vect;
      pIVar9->vect[2] = pIVar18[-1].vect[2];
      *(undefined8 *)pIVar9->vect = *(undefined8 *)pIVar14->vect;
      pIVar18[-1].vect[2] = local_e0;
      *(undefined8 *)pIVar14->vect = local_e8;
      pIVar9 = pIVar9 + 1;
      pIVar15 = pIVar14;
    } while (pIVar14 != pIVar9);
LAB_0063bf36:
    local_104 = (uint)uVar20;
    iVar6 = (this->m_bx).bigend.vect[0];
    iVar12 = (this->m_bx).bigend.vect[1];
    iVar16 = (this->m_bx).smallend.vect[0];
    iVar2 = (this->m_bx).smallend.vect[1];
    local_f0 = this->m_len;
    iVar3 = (this->m_bx).bigend.vect[2];
    iVar4 = (this->m_bx).smallend.vect[2];
    this_00 = (Cluster *)operator_new(0x30);
    local_c0 = (double)local_f0 /
               ((double)((iVar3 - iVar4) + 1) *
               (double)((iVar12 - iVar2) + 1) * (double)((iVar6 - iVar16) + 1));
    (this_00->m_bx).smallend.vect[0] = 1;
    (this_00->m_bx).smallend.vect[1] = 1;
    (this_00->m_bx).smallend.vect[2] = 1;
    (this_00->m_bx).bigend.vect[0] = 0;
    (this_00->m_bx).bigend.vect[1] = 0;
    *(undefined8 *)((this_00->m_bx).bigend.vect + 2) = 0;
    this_00->m_ar = pIVar15;
    this_00->m_len = (long)(int)local_d8;
    minBox(this_00);
    lVar8 = this_00->m_len;
    local_d8 = *(undefined8 *)(this_00->m_bx).bigend.vect;
    uStack_d0 = 0;
    local_48 = *(undefined8 *)(this_00->m_bx).smallend.vect;
    uStack_40 = 0;
    iVar6 = (this_00->m_bx).smallend.vect[2];
    iVar12 = (this_00->m_bx).bigend.vect[2];
    this->m_len = local_b8;
    minBox(this);
    uVar20 = *(undefined8 *)(this->m_bx).bigend.vect;
    uVar1 = *(undefined8 *)(this->m_bx).smallend.vect;
    if (local_c0 <
        (double)this->m_len /
        ((double)(((this->m_bx).bigend.vect[2] - (this->m_bx).smallend.vect[2]) + 1) *
        (double)(((int)((ulong)uVar20 >> 0x20) - (int)((ulong)uVar1 >> 0x20)) + 1) *
        (double)(((int)uVar20 - (int)uVar1) + 1))) goto LAB_0063c10b;
    if ((local_b0 & 1) != 0 ||
        local_c0 <
        (double)lVar8 /
        ((double)((iVar12 - iVar6) + 1) *
        (double)((local_d8._4_4_ - local_48._4_4_) + 1) *
        (double)(((int)local_d8 - (int)local_48) + 1))) goto LAB_0063c10b;
    this->m_len = (long)(int)local_f0;
    minBox(this);
    operator_delete(this_00,0x30);
    uVar19 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    uVar20 = 0;
    uVar11 = local_c8;
  } while ((local_104 & 1) != 0);
  Abort_host("Should never reach this point in Cluster::new_chop()");
  this_00 = this;
LAB_0063c10b:
  lVar8 = 0x48;
  do {
    pvVar5 = *(void **)((long)&local_b0 + lVar8);
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5,*(long *)((long)&local_a0 + lVar8) - (long)pvVar5);
    }
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != 0);
  return this_00;
}

Assistant:

Cluster*
Cluster::new_chop ()
{
    BL_ASSERT(m_len > 1);
    BL_ASSERT(!(m_ar == 0));

    const int*    lo  = m_bx.loVect();
    const int*    hi  = m_bx.hiVect();
    const IntVect len = m_bx.size();
    //
    // Compute histogram.
    //
    Array<Vector<int>,AMREX_SPACEDIM> hist;
    AMREX_D_TERM(hist[0].resize(len[0], 0);,
                 hist[1].resize(len[1], 0);,
                 hist[2].resize(len[2], 0);)
    for (int n = 0; n < m_len; n++)
    {
        const int* p = m_ar[n].getVect();
        AMREX_D_TERM( hist[0][p[0]-lo[0]]++;,
                      hist[1][p[1]-lo[1]]++;,
                      hist[2][p[2]-lo[2]]++; )
    }

    int invalid_dir = -1;
    for (int n_try = 0; n_try < 2; n_try++)
    {
       //
       // Find cutpoint and cutstatus in each index direction.
       //
       CutStatus mincut = InvalidCut;
       CutStatus status[AMREX_SPACEDIM];
       IntVect cut;
       for (int n = 0; n < AMREX_SPACEDIM; n++)
       {
           if (n != invalid_dir)
           {
              cut[n] = FindCut(hist[n].data(), lo[n], hi[n], status[n]);
              if (status[n] < mincut)
              {
                  mincut = status[n];
              }
           }
       }
       BL_ASSERT(mincut != InvalidCut);
       //
       // Select best cutpoint and direction.
       //
       int dir = -1;
       for (int n = 0, minlen = -1; n < AMREX_SPACEDIM; n++)
       {
           if (status[n] == mincut)
           {
               int mincutlen = std::min(cut[n]-lo[n],hi[n]-cut[n]);
               if (mincutlen >= minlen)
               {
                   dir = n;
                   minlen = mincutlen;
               }
           }
       }
       BL_ASSERT(dir >= 0 && dir < AMREX_SPACEDIM);

       int nlo = 0;
       for (int i = lo[dir]; i < cut[dir]; i++) {
           nlo += hist[dir][i-lo[dir]];
       }

       if (nlo <= 0 || nlo >= m_len) return chop();

       int nhi = m_len - nlo;

       IntVect* prt_it = std::partition(m_ar, m_ar+m_len, Cut(cut,dir));

       BL_ASSERT((prt_it-m_ar) == nlo);
       BL_ASSERT(((m_ar+m_len)-prt_it) == nhi);

       // These refer to the box that was originally passed in
       Real oldeff = eff();
       int orig_mlen = m_len;

       // Define the new box "above" the cut
       std::unique_ptr<Cluster> newbox(new Cluster(prt_it, nhi));
       Real neweff = newbox->eff();

       // Replace the current box by the part of the box "below" the cut
       m_len = nlo;
       minBox();

       if ( (eff() > oldeff) || (neweff > oldeff) || n_try > 0)
       {
          return newbox.release();

       } else {

          // Restore the original box and try again, cutting in a different direction
          m_len = orig_mlen;
          minBox();
          invalid_dir = dir;
       }
   }

    amrex::Abort("Should never reach this point in Cluster::new_chop()");
    return this;
}